

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::binary_escape_string(string *string_to_escape)

{
  bool bVar1;
  __type_conflict1 _Var2;
  int iVar3;
  byte *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type sqLoc;
  string code;
  stringstream stream;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *escaped_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  allocator<char> local_251;
  allocator<char> *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  undefined8 in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  stringstream local_1c0 [16];
  undefined1 local_1b0 [383];
  byte local_31;
  char *local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  __rhs = in_RDI;
  local_10 = in_RSI;
  ::std::__cxx11::string::string(in_RDI);
  local_20 = local_10;
  local_28._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(in_stack_fffffffffffffd78);
  local_30 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end(in_stack_fffffffffffffd88);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffd80,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffd78), ((bVar1 ^ 0xffU) & 1) != 0) {
    pbVar4 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_28);
    local_31 = *pbVar4;
    iVar3 = isprint((uint)local_31);
    if (iVar3 == 0) {
      ::std::__cxx11::stringstream::stringstream(local_1c0);
      in_stack_fffffffffffffd88 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::ostream::operator<<(local_1b0,std::hex);
      ::std::ostream::operator<<(in_stack_fffffffffffffd88,(uint)local_31);
      ::std::__cxx11::stringstream::str();
      in_stack_fffffffffffffd80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_251;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdc0,
                 (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
                 in_stack_fffffffffffffdb0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&local_1f0);
      ::std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      ::std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd80);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd80);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd80);
      ::std::allocator<char>::~allocator(&local_251);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd80);
      ::std::__cxx11::stringstream::~stringstream(local_1c0);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (in_RDI,(char)((ulong)in_stack_fffffffffffffd88 >> 0x38));
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  _Var2 = ::std::operator==(in_stack_fffffffffffffda0,__rhs);
  if (((_Var2 ^ 0xffU) & 1) != 0) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbf,
                      (size_type)in_stack_fffffffffffffdb0);
    while (__c = (char)((ulong)in_stack_fffffffffffffd88 >> 0x38),
          this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0xffffffffffffffff) {
      in_stack_fffffffffffffd78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
      *(value_type *)&(in_stack_fffffffffffffd78->_M_dataplus)._M_p = '\\';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (this,(size_type)__rhs,(char *)in_RDI);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbf,
                        (size_type)in_stack_fffffffffffffdb0);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff,(size_type)__rhs,(char *)in_RDI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,__c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,__c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (in_RDI,__c);
  }
  return __rhs;
}

Assistant:

CLI11_INLINE std::string binary_escape_string(const std::string &string_to_escape) {
    // s is our escaped output string
    std::string escaped_string{};
    // loop through all characters
    for(char c : string_to_escape) {
        // check if a given character is printable
        // the cast is necessary to avoid undefined behaviour
        if(isprint(static_cast<unsigned char>(c)) == 0) {
            std::stringstream stream;
            // if the character is not printable
            // we'll convert it to a hex string using a stringstream
            // note that since char is signed we have to cast it to unsigned first
            stream << std::hex << static_cast<unsigned int>(static_cast<unsigned char>(c));
            std::string code = stream.str();
            escaped_string += std::string("\\x") + (code.size() < 2 ? "0" : "") + code;

        } else {
            escaped_string.push_back(c);
        }
    }
    if(escaped_string != string_to_escape) {
        auto sqLoc = escaped_string.find('\'');
        while(sqLoc != std::string::npos) {
            escaped_string[sqLoc] = '\\';
            escaped_string.insert(sqLoc + 1, "x27");
            sqLoc = escaped_string.find('\'');
        }
        escaped_string.insert(0, "'B\"(");
        escaped_string.push_back(')');
        escaped_string.push_back('"');
        escaped_string.push_back('\'');
    }
    return escaped_string;
}